

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O1

int __thiscall ncnn::DeformableConv2D_x86::create_pipeline(DeformableConv2D_x86 *this,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  int *piVar3;
  size_t sVar4;
  void *pvVar5;
  long *plVar6;
  Allocator *pAVar7;
  Layer *pLVar8;
  int iVar9;
  ulong uVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  undefined4 *puVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int k;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  undefined4 *puVar24;
  ParamDict pd_5;
  ParamDict pd;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_18c;
  uint local_180;
  uint local_17c;
  void *local_178;
  undefined1 local_170 [16];
  ulong local_160;
  Mat local_158;
  void *local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  int iStack_f8;
  Allocator *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  size_t local_d0;
  DeformableConv2D_x86 *local_c8;
  Option *local_c0;
  ulong local_b8;
  undefined4 *local_b0;
  ModelBinFromMatArray local_a8;
  Mat local_98;
  undefined4 *local_50;
  Mat *local_48;
  long local_40;
  long local_38;
  
  switch((this->super_DeformableConv2D).activation_type) {
  case 1:
    uStack_190 = 0x5b5da4;
    pLVar8 = create_layer_cpu(0x1a);
    uStack_190 = 0x5b5db4;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5b5dc0;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  case 2:
    uStack_190 = 0x5b5e82;
    pLVar8 = create_layer_cpu(0x1a);
    uStack_190 = 0x5b5e92;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5b5ea7;
    ParamDict::set((ParamDict *)&local_158,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    uStack_190 = 0x5b5eb5;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  case 3:
    uStack_190 = 0x5b5dfa;
    pLVar8 = create_layer_cpu(0x36);
    uStack_190 = 0x5b5e0a;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5b5e1f;
    ParamDict::set((ParamDict *)&local_158,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    uStack_190 = 0x5b5e3a;
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4));
    uStack_190 = 0x5b5e48;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  case 4:
    uStack_190 = 0x5b5e57;
    pLVar8 = create_layer_cpu(0x1e);
    uStack_190 = 0x5b5e67;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5b5e73;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  case 5:
    uStack_190 = 0x5b5dcf;
    pLVar8 = create_layer_cpu(0x47);
    uStack_190 = 0x5b5ddf;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5b5deb;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  case 6:
    uStack_190 = 0x5b5ec1;
    pLVar8 = create_layer_cpu(0x43);
    uStack_190 = 0x5b5ed1;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5b5ee6;
    ParamDict::set((ParamDict *)&local_158,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    uStack_190 = 0x5b5f01;
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4));
    uStack_190 = 0x5b5f0f;
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_158);
    break;
  default:
    pLVar8 = (Layer *)0x0;
    goto LAB_005b5f19;
  }
  uStack_190 = 0x5b5f19;
  ParamDict::~ParamDict((ParamDict *)&local_158);
LAB_005b5f19:
  if (pLVar8 != (Layer *)0x0) {
    uStack_190 = 0x5b5f2a;
    (*pLVar8->_vptr_Layer[4])(pLVar8,opt);
  }
  this->activation = pLVar8;
  iVar19 = (this->super_DeformableConv2D).kernel_w;
  lVar20 = (long)iVar19;
  iVar21 = (this->super_DeformableConv2D).kernel_h;
  local_178 = (void *)(long)iVar21;
  local_17c = iVar21 * iVar19;
  uVar2 = (this->super_DeformableConv2D).num_output;
  local_b8 = (ulong)uVar2;
  uVar10 = (long)(this->super_DeformableConv2D).weight_data_size / (long)(int)local_17c;
  uVar10 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
  uVar14 = (long)uVar10 / (long)(int)uVar2;
  local_180 = (uint)uVar14;
  iVar21 = 1;
  uVar23 = 1;
  if (opt->use_packing_layout == true) {
    uVar23 = (uint)((uVar14 & 3) == 0) * 3 + 1;
    iVar21 = (uint)((uVar2 & 3) == 0) * 3 + 1;
  }
  if (opt->use_sgemm_convolution == true) {
    uStack_190 = 0x5b5fb5;
    pLVar8 = create_layer_cpu(0x4a);
    this->gemm = pLVar8;
    uStack_190 = 0x5b5fc9;
    ParamDict::ParamDict((ParamDict *)local_170);
    uStack_190 = 0x5b5fd8;
    ParamDict::set((ParamDict *)local_170,2,0);
    uStack_190 = 0x5b5fe9;
    ParamDict::set((ParamDict *)local_170,3,0);
    uStack_190 = 0x5b5ffd;
    ParamDict::set((ParamDict *)local_170,4,1);
    uStack_190 = 0x5b600e;
    ParamDict::set((ParamDict *)local_170,5,0);
    uStack_190 = 0x5b6022;
    ParamDict::set((ParamDict *)local_170,6,1);
    uStack_190 = 0x5b6037;
    ParamDict::set((ParamDict *)local_170,7,(this->super_DeformableConv2D).num_output);
    uStack_190 = 0x5b6048;
    ParamDict::set((ParamDict *)local_170,8,0);
    iVar19 = local_180 * local_17c;
    uStack_190 = 0x5b6065;
    ParamDict::set((ParamDict *)local_170,9,iVar19);
    uStack_190 = 0x5b6082;
    ParamDict::set((ParamDict *)local_170,10,
                   -(uint)((this->super_DeformableConv2D).bias_term == 0) | 1);
    uStack_190 = 0x5b6096;
    ParamDict::set((ParamDict *)local_170,0xb,1);
    uStack_190 = 0x5b60a8;
    (*this->gemm->_vptr_Layer[2])(this->gemm,local_170);
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.allocator = (Allocator *)0x0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    uStack_190 = 0x5b60ee;
    Mat::reshape(&local_158,&(this->super_DeformableConv2D).weight_data,local_17c,local_180,
                 (this->super_DeformableConv2D).num_output,(Allocator *)0x0);
    uStack_190 = 0x5b6114;
    local_c0 = opt;
    Mat::create(&local_98,iVar19,(this->super_DeformableConv2D).num_output,4,(Allocator *)0x0);
    opt = local_c0;
    lVar20 = (long)(this->super_DeformableConv2D).num_output;
    if (0 < lVar20) {
      local_178 = local_98.data;
      local_160 = (long)local_98.w * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
      ;
      uVar10 = (ulong)uVar23;
      lVar15 = 0;
      do {
        if ((int)uVar23 <= (int)local_180) {
          lVar18 = (long)local_158.w *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          puVar11 = (undefined4 *)
                    (CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) *
                     local_158.cstep * lVar15 + (long)local_158.data);
          puVar17 = (undefined4 *)(local_160 * lVar15 + (long)local_98.data);
          lVar13 = 0;
          do {
            if (0 < (int)local_17c) {
              uVar22 = 0;
              uVar14 = uVar10;
              puVar24 = puVar11;
              puVar12 = puVar11;
              do {
                do {
                  *puVar17 = *puVar24;
                  puVar17 = puVar17 + 1;
                  uVar14 = uVar14 - 1;
                  puVar24 = (undefined4 *)((long)puVar24 + lVar18);
                } while (uVar14 != 0);
                uVar22 = uVar22 + 1;
                puVar24 = puVar12 + 1;
                uVar14 = uVar10;
                puVar12 = puVar24;
              } while (uVar22 != local_17c);
            }
            lVar13 = lVar13 + uVar10;
            puVar11 = (undefined4 *)((long)puVar11 + lVar18 * uVar10);
          } while (lVar13 < (long)((long)(int)local_180 - (ulong)(uVar23 - 1)));
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != lVar20);
    }
    piVar3 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    local_c8 = this;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            uStack_190 = 0x5b64df;
            free(local_158.data);
          }
        }
        else {
          uStack_190 = 0x5b622d;
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((this->super_DeformableConv2D).bias_term == 0) {
      piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_158.data = local_98.data;
      local_158.refcount._0_4_ = local_98.refcount._0_4_;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_158.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_158.elempack = local_98.elempack;
      local_158.allocator = local_98.allocator;
      local_158.dims = local_98.dims;
      local_158.w = local_98.w;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.c = local_98.c;
      local_158.cstep = local_98.cstep;
      pLVar8 = this->gemm;
      uStack_190 = 0x5b69d3;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      uStack_190 = 0x5b69e4;
      (*pLVar8->_vptr_Layer[3])(pLVar8,&local_a8);
      uStack_190 = 0x5b69f1;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      piVar3 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              uStack_190 = 0x5b6a33;
              free(local_158.data);
            }
          }
          else {
            uStack_190 = 0x5b6a1d;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar20 = 0x40;
      do {
        *(undefined8 *)((long)&local_158.data + lVar20) = 0;
        *(undefined8 *)((long)&uStack_198 + lVar20) = 0;
        *(undefined8 *)((long)&stack0xfffffffffffffe70 + lVar20) = 0;
        *(undefined8 *)((long)((long)register0x00000020 + -0x18c) + lVar20) = 0;
        *(undefined8 *)(&stack0xfffffffffffffe7c + lVar20) = 0;
        *(undefined8 *)(local_170 + lVar20 + -8) = 0;
        *(undefined8 *)(local_170 + lVar20) = 0;
        *(undefined8 *)(local_170 + lVar20 + 4) = 0;
        *(undefined8 *)(local_170 + lVar20 + 0xc) = 0;
        lVar20 = lVar20 + 0x48;
      } while (lVar20 != 0xd0);
      piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              uStack_190 = 0x5b65c9;
              free(local_158.data);
            }
          }
          else {
            uStack_190 = 0x5b6555;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_158.data = local_98.data;
      local_158.refcount._0_4_ = local_98.refcount._0_4_;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_158.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_158.elempack = local_98.elempack;
      local_158.allocator = local_98.allocator;
      local_158.dims = local_98.dims;
      local_158.w = local_98.w;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.c = local_98.c;
      local_158.cstep = local_98.cstep;
      if ((Mat *)&local_110 != &(this->super_DeformableConv2D).bias_data) {
        piVar3 = (this->super_DeformableConv2D).bias_data.refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (int *)CONCAT44(uStack_104,uStack_108);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_f0 == (Allocator *)0x0) {
              if (local_110 != (void *)0x0) {
                uStack_190 = 0x5b6717;
                free(local_110);
              }
            }
            else {
              uStack_190 = 0x5b667e;
              (*local_f0->_vptr_Allocator[3])();
            }
          }
        }
        local_110 = (this->super_DeformableConv2D).bias_data.data;
        piVar3 = (this->super_DeformableConv2D).bias_data.refcount;
        uStack_108 = SUB84(piVar3,0);
        uStack_104 = (undefined4)((ulong)piVar3 >> 0x20);
        sVar4 = (this->super_DeformableConv2D).bias_data.elemsize;
        uStack_100 = (undefined4)sVar4;
        uStack_fc = (undefined4)(sVar4 >> 0x20);
        iStack_f8 = (this->super_DeformableConv2D).bias_data.elempack;
        local_f0 = (this->super_DeformableConv2D).bias_data.allocator;
        local_e8._0_4_ = (this->super_DeformableConv2D).bias_data.dims;
        local_e8._4_4_ = (this->super_DeformableConv2D).bias_data.w;
        uStack_e0._0_4_ = (this->super_DeformableConv2D).bias_data.h;
        uStack_e0._4_4_ = (this->super_DeformableConv2D).bias_data.d;
        local_d8 = (this->super_DeformableConv2D).bias_data.c;
        local_d0 = (this->super_DeformableConv2D).bias_data.cstep;
      }
      pLVar8 = this->gemm;
      uStack_190 = 0x5b67bb;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      uStack_190 = 0x5b67cc;
      (*pLVar8->_vptr_Layer[3])(pLVar8,&local_a8);
      uStack_190 = 0x5b67d9;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      lVar20 = 0x48;
      do {
        piVar3 = *(int **)((long)&local_158.refcount + lVar20);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar5 = *(void **)((long)&local_158.data + lVar20);
            plVar6 = *(long **)((long)&local_158.allocator + lVar20);
            if (plVar6 == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                uStack_190 = 0x5b6817;
                free(pvVar5);
              }
            }
            else {
              uStack_190 = 0x5b6805;
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_158.cstep + lVar20) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar20 + 4) = 0;
        *(undefined8 *)((long)&local_158.elemsize + lVar20 + 4) = 0;
        *(undefined8 *)((long)&local_158.data + lVar20) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar20) = 0;
        *(undefined8 *)((long)&local_158.dims + lVar20) = 0;
        *(undefined8 *)((long)&local_158.h + lVar20) = 0;
        *(undefined4 *)((long)&local_158.c + lVar20) = 0;
        lVar20 = lVar20 + -0x48;
        opt = local_c0;
      } while (lVar20 != -0x48);
    }
    uStack_190 = 0x5b685e;
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if (local_98.data != (void *)0x0) {
            uStack_190 = 0x5b689a;
            free(local_98.data);
          }
        }
        else {
          uStack_190 = 0x5b688b;
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    uStack_190 = 0x5b68d5;
    ParamDict::~ParamDict((ParamDict *)local_170);
  }
  else {
    pMVar1 = &this->weight_data_tm;
    if ((iVar21 == 1) && (uVar23 == 1)) {
      piVar3 = (this->super_DeformableConv2D).weight_data.refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data_tm).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar5 = (this->weight_data_tm).data;
          pAVar7 = (this->weight_data_tm).allocator;
          if (pAVar7 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              uStack_190 = 0x5b6690;
              free(pvVar5);
            }
          }
          else {
            uStack_190 = 0x5b628a;
            (*pAVar7->_vptr_Allocator[3])
                      (pAVar7,pvVar5,(long)uVar10 % (long)(int)uVar2 & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      piVar3 = (this->super_DeformableConv2D).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_DeformableConv2D).weight_data.data;
      (this->weight_data_tm).refcount = piVar3;
      (this->weight_data_tm).elemsize = (this->super_DeformableConv2D).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_DeformableConv2D).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_DeformableConv2D).weight_data.allocator;
      iVar19 = (this->super_DeformableConv2D).weight_data.w;
      iVar21 = (this->super_DeformableConv2D).weight_data.h;
      iVar9 = (this->super_DeformableConv2D).weight_data.d;
      (this->weight_data_tm).dims = (this->super_DeformableConv2D).weight_data.dims;
      (this->weight_data_tm).w = iVar19;
      (this->weight_data_tm).h = iVar21;
      (this->weight_data_tm).d = iVar9;
      (this->weight_data_tm).c = (this->super_DeformableConv2D).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_DeformableConv2D).weight_data.cstep;
    }
    else {
      local_50 = (undefined4 *)(this->super_DeformableConv2D).weight_data.data;
      iVar9 = uVar23 * iVar21;
      uStack_190 = 0x5b62e8;
      local_c8 = this;
      local_c0 = opt;
      local_48 = pMVar1;
      Mat::create(pMVar1,(int)(local_180 * local_17c * uVar2) / iVar9,(ulong)(uint)(iVar9 * 4),iVar9
                  ,(Allocator *)0x0);
      pMVar1 = local_48;
      if (0 < (int)uVar2) {
        pvVar5 = (local_c8->weight_data_tm).data;
        lVar15 = (long)(int)local_180 * (long)local_178 * lVar20;
        local_40 = lVar15 * 4;
        local_38 = lVar20 * 4;
        local_160 = 0;
        do {
          if (0 < (int)local_178) {
            local_b0 = local_50;
            pvVar16 = (void *)0x0;
            do {
              if (0 < iVar19) {
                lVar13 = 0;
                puVar11 = local_b0;
                do {
                  if (0 < (int)local_180) {
                    uVar10 = (ulong)(uint)((int)local_160 >> 0x1f) << 0x20 | local_160 & 0xffffffff;
                    uVar14 = 0;
                    puVar17 = puVar11;
                    do {
                      uVar22 = (ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff;
                      *(undefined4 *)
                       ((long)pvVar5 +
                       (long)(int)((((int)((long)uVar22 / (long)(int)uVar23) +
                                    ((int)lVar13 +
                                    ((int)((long)uVar10 / (long)iVar21) * (int)local_178 +
                                    (int)pvVar16) * iVar19) * (local_180 / uVar23)) * uVar23 +
                                   (int)((long)uVar22 % (long)(int)uVar23)) * iVar21 +
                                  (int)((long)uVar10 % (long)iVar21)) * 4) = *puVar17;
                      uVar14 = uVar14 + 1;
                      puVar17 = puVar17 + (long)local_178 * lVar20;
                    } while (local_180 != uVar14);
                  }
                  lVar13 = lVar13 + 1;
                  puVar11 = puVar11 + 1;
                } while (lVar13 != lVar20);
              }
              pvVar16 = (void *)((long)pvVar16 + 1);
              local_b0 = local_b0 + lVar20;
            } while (pvVar16 != local_178);
          }
          local_160 = local_160 + 1;
          local_50 = local_50 + lVar15;
        } while (local_160 != local_b8);
      }
      uStack_190 = 0x5b6466;
      Mat::reshape(&local_158,local_48,(int)local_180 / (int)uVar23,local_17c,
                   (int)((long)((ulong)(uint)((int)local_b8 >> 0x1f) << 0x20 | local_b8 & 0xffffffff
                               ) / (long)iVar21),(Allocator *)0x0);
      opt = local_c0;
      this = local_c8;
      if (&local_158 != pMVar1) {
        piVar3 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (local_c8->weight_data_tm).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar5 = (local_c8->weight_data_tm).data;
            pAVar7 = (local_c8->weight_data_tm).allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                uStack_190 = 0x5b6a45;
                free(pvVar5);
              }
            }
            else {
              uStack_190 = 0x5b64c5;
              (*pAVar7->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        (this->weight_data_tm).data = local_158.data;
        (this->weight_data_tm).refcount =
             (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        (this->weight_data_tm).elemsize =
             CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
        (this->weight_data_tm).elempack = local_158.elempack;
        (this->weight_data_tm).allocator = local_158.allocator;
        (this->weight_data_tm).dims = local_158.dims;
        (this->weight_data_tm).w = local_158.w;
        (this->weight_data_tm).h = local_158.h;
        (this->weight_data_tm).d = local_158.d;
        (this->weight_data_tm).c = local_158.c;
        (this->weight_data_tm).cstep = local_158.cstep;
      }
      piVar3 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              uStack_190 = 0x5b6aff;
              free(local_158.data);
            }
          }
          else {
            uStack_190 = 0x5b6ae9;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  if (opt->lightmode == true) {
    piVar3 = (this->super_DeformableConv2D).weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar5 = (this->super_DeformableConv2D).weight_data.data;
        pAVar7 = (this->super_DeformableConv2D).weight_data.allocator;
        if (pAVar7 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            uStack_190 = 0x5b691a;
            free(pvVar5);
          }
        }
        else {
          uStack_190 = 0x5b690b;
          (*pAVar7->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeformableConv2D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.elemsize + 4) = 0;
    (this->super_DeformableConv2D).weight_data.data = (void *)0x0;
    (this->super_DeformableConv2D).weight_data.refcount = (int *)0x0;
    (this->super_DeformableConv2D).weight_data.dims = 0;
    (this->super_DeformableConv2D).weight_data.w = 0;
    (this->super_DeformableConv2D).weight_data.h = 0;
    (this->super_DeformableConv2D).weight_data.d = 0;
    (this->super_DeformableConv2D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}